

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

int __thiscall Cipher::Processor::init(Processor *this,EVP_PKEY_CTX *ctx)

{
  TFreqMap *in_RDX;
  double dVar1;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_stack_00000008;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_stack_00000010;
  TClusters *in_stack_00000160;
  TSimilarityMap *in_stack_00000168;
  TParameters *in_stack_00000170;
  TResult *in_stack_ffffffffffffff68;
  TParameters *in_stack_ffffffffffffff70;
  TResult *this_00;
  TClusterToLetterMap *__s;
  undefined4 uVar2;
  undefined4 uVar3;
  TSimilarityMap *logMap;
  TSimilarityMap *in_stack_ffffffffffffff98;
  TParameters *in_stack_ffffffffffffffa0;
  _Base_ptr in_stack_ffffffffffffffb8;
  _Base_ptr in_stack_ffffffffffffffc0;
  _Base_ptr in_stack_ffffffffffffffc8;
  TParameters *in_stack_ffffffffffffffd0;
  
  TParameters::operator=(in_stack_ffffffffffffff70,(TParameters *)in_stack_ffffffffffffff68);
  this->m_freqMap = in_RDX;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(in_stack_00000010,in_stack_00000008);
  uVar2 = 0;
  uVar3 = 0xc479c000;
  logMap = (TSimilarityMap *)0xc08f380000000000;
  this_00 = (TResult *)&stack0xffffffffffffff98;
  memset(this_00,0,0x30);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1bb3e5)
  ;
  __s = (TClusterToLetterMap *)&stack0xffffffffffffffc8;
  memset(__s,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bb409);
  TResult::operator=(this_00,in_stack_ffffffffffffff68);
  TResult::~TResult(this_00);
  normalizeSimilarityMap
            (in_stack_ffffffffffffffd0,(TSimilarityMap *)in_stack_ffffffffffffffc8,
             (TSimilarityMap *)in_stack_ffffffffffffffc0,(TSimilarityMap *)in_stack_ffffffffffffffb8
            );
  generateClustersInitialGuess(in_stack_00000170,in_stack_00000168,in_stack_00000160);
  this->m_nInitialIters = 0;
  dVar1 = calcPClusters(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,logMap,
                        (TSimilarityMap *)CONCAT44(uVar3,uVar2),(TClusters *)this,__s);
  this->m_pCur = dVar1;
  (this->m_curResult).pClusters = this->m_pCur;
  this->m_pZero = this->m_pCur;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool Processor::init(
            const TParameters & params,
            const TFreqMap & freqMap,
            const TSimilarityMap & similarityMap) {
        m_params = params;
        m_freqMap = &freqMap;
        m_similarityMap = similarityMap;
        m_curResult = {};

        normalizeSimilarityMap(m_params, m_similarityMap, m_logMap, m_logMapInv);
        generateClustersInitialGuess(m_params, m_similarityMap, m_curResult.clusters);

        //Cipher::beamSearch(m_params, *m_freqMap, m_curResult);
        m_nInitialIters = 0;
        m_pCur = calcPClusters(m_params, m_similarityMap, m_logMap, m_logMapInv, m_curResult.clusters, m_curResult.clMap);
        m_curResult.pClusters = m_pCur;
        m_pZero = m_pCur;

        return true;
    }